

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_bitmapblit_rgb30<(QtPixelOrder)1>
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  QRgba64 QVar1;
  QRgba64 QVar2;
  long in_FS_OFFSET;
  QRgba64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = (QRgba64)color->rgba;
  local_40.rgba = QVar2.rgba;
  if (1 < (ushort)((short)(QVar2.rgba >> 0x30) + 1U)) {
    QVar1 = QRgba64::unpremultiplied(&local_40);
    local_40.rgba =
         (ulong)((uint)(QVar2.rgba >> 0x3e) * 0x5555) << 0x30 | QVar1.rgba & 0xffffffffffff;
    QVar2 = QRgba64::premultiplied(&local_40);
  }
  qt_bitmapblit_template<unsigned_int>
            (rasterBuffer,x,y,
             (uint)QVar2.rgba >> 0xc & 0xffc00 |
             (uint)(QVar2.rgba >> 0x12) & 0x3ff00000 | (uint)(QVar2.rgba >> 0x20) & 0xc0000000 |
             (uint)(QVar2.rgba >> 6) & 0x3ff,map,mapWidth,mapHeight,mapStride);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline static void qt_bitmapblit_rgb30(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    qt_bitmapblit_template<quint32>(rasterBuffer, x, y, qConvertRgb64ToRgb30<PixelOrder>(color),
                                    map, mapWidth, mapHeight, mapStride);
}